

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

void __thiscall
create::RobotModel::RobotModel
          (RobotModel *this,ProtocolVersion version,float axleLength,uint baud,float maxVelocity,
          float wheelDiameter)

{
  this->id = nextId;
  this->version = version;
  this->axleLength = axleLength;
  this->baud = baud;
  this->maxVelocity = maxVelocity;
  this->wheelDiameter = wheelDiameter;
  nextId = nextId * 2;
  return;
}

Assistant:

RobotModel::RobotModel(const ProtocolVersion version, const float axleLength, const unsigned int baud, const float maxVelocity, const float wheelDiameter):
    id(nextId),
    version(version),
    axleLength(axleLength),
    baud(baud),
    maxVelocity(maxVelocity),
    wheelDiameter(wheelDiameter) {
    nextId <<= 1;
  }